

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  cmState *this_00;
  char *pcVar1;
  mapped_type *pmVar2;
  string fname;
  cmOutputConverter converter;
  RuleHash hash;
  allocator local_a9;
  undefined1 local_a8 [32];
  string local_88;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_a8,AlgoMD5);
    cmCryptoHash::HashString(&local_68,(cmCryptoHash *)local_a8,content);
    local_48 = *(undefined8 *)local_68._M_dataplus._M_p;
    uStack_40 = *(undefined8 *)(local_68._M_dataplus._M_p + 8);
    local_38 = *(undefined8 *)(local_68._M_dataplus._M_p + 0x10);
    uStack_30 = *(undefined8 *)(local_68._M_dataplus._M_p + 0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_a8);
    cmMakefile::GetStateSnapshot
              (*(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_start);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_68,(cmStateSnapshot *)local_a8)
    ;
    this_00 = cmMakefile::GetState
                        (*(this->Makefiles).
                          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pcVar1 = cmState::GetBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&local_88,pcVar1,&local_a9);
    cmOutputConverter::ConvertToRelativePath
              ((string *)local_a8,(cmOutputConverter *)&local_68,&local_88,
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::operator[](&this->RuleHashes,(key_type *)local_a8);
    *(undefined8 *)(pmVar2->Data + 0x10) = local_38;
    *(undefined8 *)(pmVar2->Data + 0x18) = uStack_30;
    *(undefined8 *)pmVar2->Data = local_48;
    *(undefined8 *)(pmVar2->Data + 8) = uStack_40;
    if ((cmState *)local_a8._0_8_ != (cmState *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  std::string exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::vector<std::string>::iterator i = extensionList.begin();
       i != extensionList.end(); ++i) {
    this->ExtensionToLanguage[*i] = l;
  }
}